

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int ffsrow(fitsfile *infptr,fitsfile *outfptr,char *expr,int *status)

{
  char *pcVar1;
  char cVar2;
  size_t nchars;
  long firstrow;
  long lVar3;
  bool bVar4;
  int iVar5;
  uchar *values;
  FITSfile *pFVar6;
  long lVar7;
  LONGLONG bytepos;
  size_t __size;
  LONGLONG nrows;
  long lVar8;
  long lVar9;
  LONGLONG local_230;
  long local_220;
  long nelem;
  long local_1f8;
  LONGLONG offset;
  long local_1e8;
  LONGLONG repeat;
  int naxis;
  parseInfo Info;
  ParseData lParse;
  long naxes [5];
  
  if (*status != 0) {
    return *status;
  }
  memset(&Info,0,0x90);
  iVar5 = ffiprs(infptr,0,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  lVar7 = nelem;
  if (iVar5 == 0) {
    if (nelem < 0) {
      nelem = -nelem;
    }
    if ((Info.datatype != 0xe) || (nelem != 1)) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      *status = 0x1b0;
      return 0x1b0;
    }
    if (infptr->HDUposition != infptr->Fptr->curhdu) {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*status == 0) {
      pFVar6 = infptr->Fptr;
      lVar9 = pFVar6->numrows;
      if (lVar9 != 0) {
        nchars = pFVar6->rowlength;
        local_220 = pFVar6->heapsize;
        if (outfptr->HDUposition != outfptr->Fptr->curhdu) {
          ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
        }
        if (outfptr->Fptr->datastart < 0) {
          ffrdef(outfptr,status);
        }
        if (*status == 0) {
          pFVar6 = outfptr->Fptr;
          firstrow = pFVar6->numrows;
          if (firstrow == 0) {
            pFVar6->heapsize = 0;
          }
          if (nchars != pFVar6->rowlength) {
            ffpmsg("Output table has different row length from input");
            ffcprs(&lParse);
            *status = 0x1b4;
            return 0x1b4;
          }
          lVar3 = pFVar6->heapsize;
          Info.dataPtr = malloc(lVar9 + 1);
          Info.nullPtr = (void *)0x0;
          Info.maxRows = lVar9;
          Info.parseData = &lParse;
          if (Info.dataPtr == (void *)0x0) {
            ffpmsg("Unable to allocate memory for row selection");
LAB_0012b5e8:
            ffcprs(&lParse);
            *status = 0x71;
            return 0x71;
          }
          *(undefined1 *)((long)Info.dataPtr + lVar9) = 0;
          if (lVar7 < 0) {
            cVar2 = lParse.Nodes[lParse.resultNode].value.data.log;
            if (0 < lVar9) {
              lVar7 = 0;
              do {
                *(char *)((long)Info.dataPtr + lVar7) = cVar2;
                lVar7 = lVar7 + 1;
              } while (lVar9 != lVar7);
            }
            nrows = 0;
            if (cVar2 != '\0') {
              nrows = lVar9;
            }
          }
          else {
            ffiter(lParse.nCols,lParse.colData,0,0,fits_parser_workfn,&Info,status);
            nrows = 0;
            if (0 < lVar9) {
              lVar7 = 0;
              nrows = 0;
              do {
                nrows = (nrows + 1) - (ulong)(*(char *)((long)Info.dataPtr + lVar7) == '\0');
                lVar7 = lVar7 + 1;
              } while (lVar9 != lVar7);
            }
          }
          if (*status == 0) {
            __size = 500000;
            if (500000 < (long)nchars) {
              __size = nchars;
            }
            values = (uchar *)malloc(__size);
            if (values == (uchar *)0x0) goto LAB_0012b5e8;
            local_1e8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(500000)) / SEXT816((long)nchars),0);
            lVar7 = 1;
            if (local_1e8 < 2) {
              local_1e8 = 1;
            }
            if (infptr == outfptr) {
              lVar7 = 0;
              do {
                local_230 = lVar7 + 1;
                pcVar1 = (char *)((long)Info.dataPtr + lVar7);
                lVar7 = local_230;
              } while (*pcVar1 != '\0');
            }
            else {
              local_230 = firstrow + 1;
              if (0 < firstrow) {
                ffirow(outfptr,firstrow,nrows,status);
              }
            }
            lVar8 = 0;
            local_1f8 = lVar9;
            do {
              if (*(char *)((long)Info.dataPtr + lVar7 + -1) != '\0') {
                ffgtbb(infptr,lVar7,1,nchars,values + lVar8 * nchars,status);
                lVar8 = lVar8 + 1;
                lVar9 = local_1f8;
                if (lVar8 == local_1e8) {
                  ffptbb(outfptr,local_230,1,lVar8 * nchars,values,status);
                  local_230 = local_230 + lVar8;
                  lVar8 = 0;
                  lVar9 = local_1f8;
                }
              }
            } while ((lVar7 < lVar9) && (lVar7 = lVar7 + 1, *status == 0));
            if (lVar8 != 0) {
              ffptbb(outfptr,local_230,1,nchars * lVar8,values,status);
              local_230 = local_230 + lVar8;
            }
            if (infptr == outfptr) {
              if (local_230 <= lVar9) {
                ffdrow(infptr,local_230,(lVar9 - local_230) + 1,status);
              }
            }
            else if ((local_220 != 0) && (nrows != 0)) {
              if (outfptr->HDUposition != outfptr->Fptr->curhdu) {
                ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
              }
              lVar7 = outfptr->Fptr->datastart;
              lVar9 = outfptr->Fptr->heapstart;
              lVar8 = (lVar3 + 0xb3f + lVar9) % 0xb40;
              if (0xb3f - lVar8 < local_220) {
                ffiblk(outfptr,(lVar8 + local_220) / 0xb40,1,status);
              }
              ffukyj(outfptr,"PCOUNT",lVar3 + local_220,(char *)0x0,status);
              if (infptr->HDUposition != infptr->Fptr->curhdu) {
                ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
              }
              bytepos = infptr->Fptr->heapstart + infptr->Fptr->datastart;
              lVar7 = lVar9 + lVar3 + lVar7;
              do {
                if (*status != 0) break;
                lVar9 = 500000;
                if (local_220 < 500000) {
                  lVar9 = local_220;
                }
                ffmbyt(infptr,bytepos,0,status);
                ffgbyt(infptr,lVar9,values,status);
                ffmbyt(outfptr,lVar7,1,status);
                ffpbyt(outfptr,lVar9,values,status);
                bytepos = bytepos + lVar9;
                lVar7 = lVar7 + lVar9;
                local_220 = local_220 - lVar9;
              } while (local_220 != 0);
              if ((lVar3 != 0) && (pFVar6 = outfptr->Fptr, 0 < pFVar6->tfield)) {
                lVar7 = 1;
                do {
                  if ((pFVar6->tableptr[lVar7 + -1].tdatatype < 0) && (lVar9 = firstrow, 0 < nrows))
                  {
                    do {
                      lVar9 = lVar9 + 1;
                      ffgdesll(outfptr,(int)lVar7,lVar9,&repeat,&offset,status);
                      offset = offset + lVar3;
                      ffpdes(outfptr,(int)lVar7,lVar9,repeat,offset,status);
                    } while (lVar9 < firstrow + nrows);
                  }
                  pFVar6 = outfptr->Fptr;
                  bVar4 = lVar7 < pFVar6->tfield;
                  lVar7 = lVar7 + 1;
                } while (bVar4);
              }
            }
            free(values);
          }
          if (Info.dataPtr == (void *)0x0) {
            printf("invalid free(Info.dataPtr) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,400);
          }
          else {
            free(Info.dataPtr);
          }
          ffcprs(&lParse);
          ffcmph(outfptr,status);
          goto LAB_0012b3ee;
        }
      }
    }
  }
  ffcprs(&lParse);
LAB_0012b3ee:
  return *status;
}

Assistant:

int ffsrow( fitsfile *infptr,   /* I - Input FITS file                      */
            fitsfile *outfptr,  /* I - Output FITS file                     */
            char     *expr,     /* I - Boolean expression                   */
            int      *status )  /* O - Error status                         */
/*                                                                          */
/* Evaluate an expression on all rows of a table.  If the input and output  */
/* files are not the same, copy the TRUE rows to the output file.  If the   */
/* files are the same, delete the FALSE rows (preserve the TRUE rows).      */
/* Can copy rows between extensions of the same file, *BUT* if output       */
/* extension is before the input extension, the second extension *MUST* be  */
/* opened using ffreopen, so that CFITSIO can handle changing file lengths. */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, rdlen, naxes[MAXDIMS], maxrows, nbuff, nGood, inloc, outloc;
   LONGLONG ntodo, inbyteloc, outbyteloc, hsize;
   long freespace;
   unsigned char *buffer, result;
   struct {
      LONGLONG rowLength, numRows, heapSize;
      LONGLONG dataStart, heapStart;
   } inExt, outExt;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   
   memset(&inExt, 0, sizeof(inExt));
   memset(&outExt, 0, sizeof(outExt));

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   /**********************************************************************/
   /* Make sure expression evaluates to the right type... logical scalar */
   /**********************************************************************/

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /***********************************************************/
   /*  Extract various table information from each extension  */
   /***********************************************************/

   if( infptr->HDUposition != (infptr->Fptr)->curhdu )
      ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   inExt.rowLength = (long) (infptr->Fptr)->rowlength;
   inExt.numRows   = (infptr->Fptr)->numrows;
   inExt.heapSize  = (infptr->Fptr)->heapsize;
   if( inExt.numRows == 0 ) { /* Nothing to copy */
      ffcprs(&lParse);
      return( *status );
   }

   if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
      ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
   if( (outfptr->Fptr)->datastart < 0 )
      ffrdef( outfptr, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   outExt.rowLength = (long) (outfptr->Fptr)->rowlength;
   outExt.numRows   = (outfptr->Fptr)->numrows;
   if( !outExt.numRows )
      (outfptr->Fptr)->heapsize = 0L;
   outExt.heapSize  = (outfptr->Fptr)->heapsize;

   if( inExt.rowLength != outExt.rowLength ) {
      ffpmsg("Output table has different row length from input");
      ffcprs(&lParse);
      return( *status = PARSE_BAD_OUTPUT );
   }

   /***********************************/
   /*  Fill out Info data for parser  */
   /***********************************/

   Info.dataPtr = (char *)malloc( (size_t) ((inExt.numRows + 1) * sizeof(char)) );
   Info.nullPtr = NULL;
   Info.maxRows = (long) inExt.numRows;
   Info.parseData = &lParse;
   if( !Info.dataPtr ) {
      ffpmsg("Unable to allocate memory for row selection");
      ffcprs(&lParse);
      return( *status = MEMORY_ALLOCATION );
   }
   
   /* make sure array is zero terminated */
   ((char*)Info.dataPtr)[inExt.numRows] = 0;

   if( constant ) { /*  Set all rows to the same value from constant result  */

      result = lParse.Nodes[lParse.resultNode].value.data.log;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         ((char*)Info.dataPtr)[ntodo] = result;
      nGood = (long) (result ? inExt.numRows : 0);

   } else {

      ffiter( lParse.nCols, lParse.colData, 0L, 0L,
              fits_parser_workfn, (void*)&Info, status );

      nGood = 0;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         if( ((char*)Info.dataPtr)[ntodo] ) nGood++;
   }

   if( *status ) {
      /* Error... Do nothing */
   } else {
      rdlen  = (long) inExt.rowLength;
      buffer = (unsigned char *)malloc(maxvalue(500000,rdlen) * sizeof(char) );
      if( buffer==NULL ) {
         ffcprs(&lParse);
         return( *status=MEMORY_ALLOCATION );
      }
      maxrows = maxvalue( (500000L/rdlen), 1);
      nbuff = 0;
      inloc = 1;
      if( infptr==outfptr ) { /* Skip initial good rows if input==output file */
         while( ((char*)Info.dataPtr)[inloc-1] ) inloc++;
         outloc = inloc;
      } else {
         outloc = (long) (outExt.numRows + 1);
         if (outloc > 1) 
            ffirow( outfptr, outExt.numRows, nGood, status );
      }

      do {
         if( ((char*)Info.dataPtr)[inloc-1] ) {
            ffgtbb( infptr, inloc, 1L, rdlen, buffer+rdlen*nbuff, status );
            nbuff++;
            if( nbuff==maxrows ) {
               ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
               outloc += nbuff;
               nbuff = 0;
            }
         }
         inloc++;
      } while( !*status && inloc<=inExt.numRows );

      if( nbuff ) {
         ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
         outloc += nbuff;
      }

      if( infptr==outfptr ) {

         if( outloc<=inExt.numRows )
            ffdrow( infptr, outloc, inExt.numRows-outloc+1, status );

      } else if( inExt.heapSize && nGood ) {

         /* Copy heap, if it exists and at least one row copied */

         /********************************************************/
         /*  Get location information from the output extension  */
         /********************************************************/

         if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
            ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
         outExt.dataStart = (outfptr->Fptr)->datastart;
         outExt.heapStart = (outfptr->Fptr)->heapstart;

         /*************************************************/
         /*  Insert more space into outfptr if necessary  */
         /*************************************************/

         hsize     = outExt.heapStart + outExt.heapSize;
         freespace = (long) (( ( (hsize + 2879) / 2880) * 2880) - hsize);
         ntodo     = inExt.heapSize;

         if ( (freespace - ntodo) < 0) {       /* not enough existing space? */
            ntodo = (ntodo - freespace + 2879) / 2880;  /* number of blocks  */
            ffiblk(outfptr, (long) ntodo, 1, status);   /* insert the blocks */
         }
         ffukyj( outfptr, "PCOUNT", inExt.heapSize+outExt.heapSize,
                 NULL, status );

         /*******************************************************/
         /*  Get location information from the input extension  */
         /*******************************************************/

         if( infptr->HDUposition != (infptr->Fptr)->curhdu )
            ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
         inExt.dataStart = (infptr->Fptr)->datastart;
         inExt.heapStart = (infptr->Fptr)->heapstart;

         /**********************************/
         /*  Finally copy heap to outfptr  */
         /**********************************/

         ntodo  =  inExt.heapSize;
         inbyteloc  =  inExt.heapStart +  inExt.dataStart;
         outbyteloc = outExt.heapStart + outExt.dataStart + outExt.heapSize;

         while ( ntodo && !*status ) {
            rdlen = (long) minvalue(ntodo,500000);
            ffmbyt( infptr,  inbyteloc,  REPORT_EOF, status );
            ffgbyt( infptr,  rdlen,  buffer,     status );
            ffmbyt( outfptr, outbyteloc, IGNORE_EOF, status );
            ffpbyt( outfptr, rdlen,  buffer,     status );
            inbyteloc  += rdlen;
            outbyteloc += rdlen;
            ntodo  -= rdlen;
         }

         /***********************************************************/
         /*  But must update DES if data is being appended to a     */
         /*  pre-existing heap space.  Edit each new entry in file  */
         /***********************************************************/

         if( outExt.heapSize ) {
            LONGLONG repeat, offset, j;
            int i;
            for( i=1; i<=(outfptr->Fptr)->tfield; i++ ) {
               if( (outfptr->Fptr)->tableptr[i-1].tdatatype<0 ) {
                  for( j=outExt.numRows+1; j<=outExt.numRows+nGood; j++ ) {
                     ffgdesll( outfptr, i, j, &repeat, &offset, status );
                     offset += outExt.heapSize;
                     ffpdes( outfptr, i, j, repeat, offset, status );
                  }
               }
            }
         }

      } /*  End of HEAP copy  */

      FREE(buffer);
   }

   FREE(Info.dataPtr);
   ffcprs(&lParse);

   ffcmph(outfptr, status);  /* compress heap, deleting any orphaned data */
   return(*status);
}